

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSqueezeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  size_t *__rhs;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SqueezeLayerParams *pSVar6;
  string *psVar7;
  int64_t iVar8;
  Tensor *pTVar9;
  iterator iVar10;
  iterator __last;
  reference piVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [8];
  string err_4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_298;
  int local_28c;
  iterator iStack_288;
  int min_value;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_280;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_278;
  int local_26c;
  undefined1 local_268 [4];
  int max_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string err_3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1f0;
  int local_1e8;
  int local_1e4;
  int a_1;
  int i_1;
  vector<int,_std::allocator<int>_> axes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string err_2;
  int axes_length;
  int output_rank;
  int input_rank;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string err_1;
  _Self local_e0;
  key_type_conflict local_d8;
  int local_d4;
  int a;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string err;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  Result::~Result(__return_storage_ptr__);
  err.field_2._M_local_buf[0xf] = '\0';
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    err.field_2._M_local_buf[0xf] = '\x01';
  }
  if ((err.field_2._M_local_buf[0xf] & 1U) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  pSVar6 = Specification::NeuralNetworkLayer::squeeze(layer);
  bVar1 = Specification::SqueezeLayerParams::squeezeall(pSVar6);
  if (bVar1) goto LAB_004dfeaf;
  pSVar6 = Specification::NeuralNetworkLayer::squeeze(layer);
  iVar2 = Specification::SqueezeLayerParams::axes_size(pSVar6);
  if (iVar2 == 0) {
    psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
    __rhs = &axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::__cxx11::string::string((string *)__rhs,(string *)psVar7);
    std::operator+(&local_80,"Squeeze Layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_80,"\': length of the \'axes\' parameter cannot be 0.");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string
              ((string *)&axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    return __return_storage_ptr__;
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&a);
  local_d4 = 0;
  while( true ) {
    iVar2 = local_d4;
    pSVar6 = Specification::NeuralNetworkLayer::squeeze(layer);
    iVar3 = Specification::SqueezeLayerParams::axes_size(pSVar6);
    if (iVar3 <= iVar2) break;
    pSVar6 = Specification::NeuralNetworkLayer::squeeze(layer);
    iVar8 = Specification::SqueezeLayerParams::axes(pSVar6,local_d4);
    local_d8 = (key_type_conflict)iVar8;
    local_e0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)&a,&local_d8);
    err_1.field_2._8_8_ =
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)&a);
    bVar1 = std::operator!=(&local_e0,(_Self *)((long)&err_1.field_2 + 8));
    if (bVar1) {
      psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
      std::__cxx11::string::string((string *)&local_148,(string *)psVar7);
      std::operator+(&local_128,"Squeeze Layer \'",&local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_128,"\': all the values in the \'axes\' parameter must be unique.");
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
      bVar1 = true;
      std::__cxx11::string::~string((string *)local_108);
      goto LAB_004dfe88;
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&a,&local_d8);
    local_d4 = local_d4 + 1;
  }
  iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
  if ((iVar2 < 1) ||
     (iVar2 = Specification::NeuralNetworkLayer::outputtensor_size(layer), iVar2 < 1)) {
LAB_004dfe81:
    bVar1 = false;
  }
  else {
    pTVar9 = Specification::NeuralNetworkLayer::inputtensor(layer,0);
    uVar4 = Specification::Tensor::rank(pTVar9);
    pTVar9 = Specification::NeuralNetworkLayer::outputtensor(layer,0);
    uVar5 = Specification::Tensor::rank(pTVar9);
    pSVar6 = Specification::NeuralNetworkLayer::squeeze(layer);
    err_2.field_2._12_4_ = Specification::SqueezeLayerParams::axes_size(pSVar6);
    if ((uVar4 == 1) || (uVar5 + err_2.field_2._12_4_ == uVar4)) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&a_1);
      for (local_1e4 = 0; local_1e4 < (int)err_2.field_2._12_4_; local_1e4 = local_1e4 + 1) {
        pSVar6 = Specification::NeuralNetworkLayer::squeeze(layer);
        iVar8 = Specification::SqueezeLayerParams::axes(pSVar6,local_1e4);
        local_1e8 = (int)iVar8;
        if (local_1e8 < 0) {
          local_1e8 = uVar4 + local_1e8;
        }
        iVar10 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&a_1);
        __last = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&a_1);
        local_1f0 = std::
                    find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                              (iVar10._M_current,__last._M_current,&local_1e8);
        err_3.field_2._8_8_ =
             std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&a_1);
        bVar1 = __gnu_cxx::operator!=
                          (&local_1f0,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           ((long)&err_3.field_2 + 8));
        if (bVar1) {
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          std::__cxx11::string::string((string *)local_268,(string *)psVar7);
          std::operator+(&local_248,"Squeeze Layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_268);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_228,&local_248,
                         "\': axes parameter list cannot have the same value more than once.");
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::~string((string *)local_268);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_228);
          bVar1 = true;
          std::__cxx11::string::~string((string *)local_228);
          goto LAB_004dfe5c;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&a_1,&local_1e8);
      }
      local_280._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&a_1);
      iStack_288 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)&a_1);
      local_278 = std::
                  max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (local_280,iStack_288._M_current);
      piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_278);
      local_26c = *piVar11;
      iVar10 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&a_1);
      err_4.field_2._8_8_ =
           std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&a_1);
      local_298 = std::
                  min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (iVar10._M_current,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             err_4.field_2._8_8_);
      piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_298);
      local_28c = *piVar11;
      if (((int)(uVar4 - 1) < local_26c) || (local_28c < 0)) {
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::__cxx11::string::string((string *)&local_308,(string *)psVar7);
        std::operator+(&local_2e8,"Squeeze Layer \'",&local_308);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c8,&local_2e8,
                       "\': axes refers to a dimension that exceeds the input rank.");
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_2c8);
        bVar1 = true;
        std::__cxx11::string::~string((string *)local_2c8);
      }
      else {
        bVar1 = false;
      }
LAB_004dfe5c:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&a_1);
      if (!bVar1) goto LAB_004dfe81;
    }
    else {
      psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
      std::__cxx11::string::string
                ((string *)
                 &axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage,(string *)psVar7);
      std::operator+(&local_1a8,"Squeeze Layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     &local_1a8,
                     "\': output rank plus the length of the axes parameter must equal input rank.")
      ;
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string
                ((string *)
                 &axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_188);
      bVar1 = true;
      std::__cxx11::string::~string((string *)local_188);
    }
  }
LAB_004dfe88:
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&a);
  if (bVar1) {
    return __return_storage_ptr__;
  }
LAB_004dfeaf:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSqueezeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (!layer.squeeze().squeezeall()) {

        if (layer.squeeze().axes_size() == 0) {
            std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        // either all values in axes must be positive or all negative
        std::set<int> axes_set;
        for (int i=0; i<layer.squeeze().axes_size(); i++) {
            int a = (int)layer.squeeze().axes(i);
            if (axes_set.find(a) != axes_set.end()) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            } else {
                axes_set.insert(a);
            }
        }

        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            int input_rank = static_cast<int>(layer.inputtensor(0).rank());
            int output_rank = static_cast<int>(layer.outputtensor(0).rank());
            int axes_length = layer.squeeze().axes_size();

            if (input_rank != 1) {
                if (output_rank + axes_length != input_rank) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': output rank plus the length of the axes parameter must equal input rank.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }

            std::vector<int> axes;
            for (int i=0; i<axes_length; i++) {
                int a = (int)layer.squeeze().axes(i);
                if (a < 0) {
                    a = input_rank + a;
                }
                if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                axes.push_back(a);
            }

            int max_value = *std::max_element(axes.begin(), axes.end());
            int min_value = *std::min_element(axes.begin(), axes.end());
            if (max_value > input_rank - 1 || min_value < 0) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the input rank.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return Result();
}